

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t utf16_to_unicode(uint32_t *pwc,char *s,size_t n,wchar_t be)

{
  ushort uVar1;
  uint local_40;
  uint local_3c;
  uint uc2;
  uint uc;
  char *utf16;
  wchar_t be_local;
  size_t n_local;
  char *s_local;
  uint32_t *pwc_local;
  
  if (n == 0) {
    pwc_local._4_4_ = L'\0';
  }
  else if (n == 1) {
    *pwc = 0xfffd;
    pwc_local._4_4_ = L'\xffffffff';
  }
  else {
    if (be == L'\0') {
      uVar1 = archive_le16dec(s);
    }
    else {
      uVar1 = archive_be16dec(s);
    }
    local_3c = (uint)uVar1;
    _uc2 = s + 2;
    if ((0xd7ff < local_3c) && (local_3c < 0xdc00)) {
      if (n < 4) {
        local_40 = 0;
      }
      else {
        if (be == L'\0') {
          uVar1 = archive_le16dec(_uc2);
        }
        else {
          uVar1 = archive_be16dec(_uc2);
        }
        local_40 = (uint)uVar1;
      }
      if ((local_40 < 0xdc00) || (0xdfff < local_40)) {
        *pwc = 0xfffd;
        return L'\xfffffffe';
      }
      local_3c = combine_surrogate_pair(local_3c,local_40);
      _uc2 = s + 4;
    }
    if (((local_3c < 0xd800) || (0xdfff < local_3c)) && (local_3c < 0x110000)) {
      *pwc = local_3c;
      pwc_local._4_4_ = (int)_uc2 - (int)s;
    }
    else {
      *pwc = 0xfffd;
      pwc_local._4_4_ = -((int)_uc2 - (int)s);
    }
  }
  return pwc_local._4_4_;
}

Assistant:

static int
utf16_to_unicode(uint32_t *pwc, const char *s, size_t n, int be)
{
	const char *utf16 = s;
	unsigned uc;

	if (n == 0)
		return (0);
	if (n == 1) {
		/* set the Replacement Character instead. */
		*pwc = UNICODE_R_CHAR;
		return (-1);
	}

	if (be)
		uc = archive_be16dec(utf16);
	else
		uc = archive_le16dec(utf16);
	utf16 += 2;
		
	/* If this is a surrogate pair, assemble the full code point.*/
	if (IS_HIGH_SURROGATE_LA(uc)) {
		unsigned uc2;

		if (n >= 4) {
			if (be)
				uc2 = archive_be16dec(utf16);
			else
				uc2 = archive_le16dec(utf16);
		} else
			uc2 = 0;
		if (IS_LOW_SURROGATE_LA(uc2)) {
			uc = combine_surrogate_pair(uc, uc2);
			utf16 += 2;
		} else {
	 		/* Undescribed code point should be U+FFFD
		 	* (replacement character). */
			*pwc = UNICODE_R_CHAR;
			return (-2);
		}
	}

	/*
	 * Surrogate pair values(0xd800 through 0xdfff) are only
	 * used by UTF-16, so, after above culculation, the code
	 * must not be surrogate values, and Unicode has no codes
	 * larger than 0x10ffff. Thus, those are not leagal Unicode
	 * values.
	 */
	if (IS_SURROGATE_PAIR_LA(uc) || uc > UNICODE_MAX) {
	 	/* Undescribed code point should be U+FFFD
	 	* (replacement character). */
		*pwc = UNICODE_R_CHAR;
		return (((int)(utf16 - s)) * -1);
	}
	*pwc = uc;
	return ((int)(utf16 - s));
}